

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O2

void __thiscall
iqxmlrpc::anon_unknown_0::Https_server_connection::log_unknown_exception
          (Https_server_connection *this)

{
  Server *this_00;
  allocator<char> local_31;
  string local_30;
  
  this_00 = (this->super_Server_connection).server;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"iqxmlrpc::Https_server_connection: unknown exception.",&local_31);
  Server::log_err_msg(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Https_server_connection::log_unknown_exception()
{
  server->log_err_msg( "iqxmlrpc::Https_server_connection: unknown exception." );
}